

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Config::Config(Config *this,ConfigData *data)

{
  bool bVar1;
  IStream *__p;
  TestSpecParser *pTVar2;
  long in_RSI;
  undefined8 *in_RDI;
  size_t i;
  TestSpecParser parser;
  TestSpec *in_stack_ffffffffffffff18;
  TestSpecParser *in_stack_ffffffffffffff20;
  TestSpecParser *this_00;
  TestSpecParser *this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  ConfigData *arg;
  ConfigData *in_stack_ffffffffffffff50;
  TestSpecParser *local_98;
  Config *in_stack_ffffffffffffff78;
  
  SharedImpl<Catch::IConfig>::SharedImpl((SharedImpl<Catch::IConfig> *)in_stack_ffffffffffffff20);
  *in_RDI = &PTR__Config_00237f78;
  arg = (ConfigData *)(in_RDI + 2);
  ConfigData::ConfigData(in_stack_ffffffffffffff50,arg);
  this_02 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(in_RDI + 0x19);
  __p = openStream(in_stack_ffffffffffffff78);
  std::auto_ptr<const_Catch::IStream>::auto_ptr((auto_ptr<const_Catch::IStream> *)this_02,__p);
  this_01 = (TestSpecParser *)(in_RDI + 0x1a);
  TestSpec::TestSpec((TestSpec *)0x1d5b34);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(this_02);
  if (!bVar1) {
    ITagAliasRegistry::get();
    TestSpecParser::TestSpecParser
              (in_stack_ffffffffffffff20,(ITagAliasRegistry *)in_stack_ffffffffffffff18);
    local_98 = (TestSpecParser *)0x0;
    while( true ) {
      this_00 = local_98;
      pTVar2 = (TestSpecParser *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(in_RSI + 0xa0));
      if (pTVar2 <= this_00) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RSI + 0xa0),(size_type)local_98);
      TestSpecParser::parse((TestSpecParser *)in_stack_ffffffffffffff50,(string *)arg);
      local_98 = (TestSpecParser *)
                 ((long)&(((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                            *)&local_98->m_mode)->
                         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                         )._M_impl.super__Vector_impl_data._M_start + 1);
    }
    TestSpecParser::testSpec(this_01);
    TestSpec::operator=((TestSpec *)this_00,in_stack_ffffffffffffff18);
    TestSpec::~TestSpec((TestSpec *)0x1d5c6f);
    TestSpecParser::~TestSpecParser(this_00);
  }
  return;
}

Assistant:

Config( ConfigData const& data )
        :   m_data( data ),
            m_stream( openStream() )
        {
            if( !data.testsOrTags.empty() ) {
                TestSpecParser parser( ITagAliasRegistry::get() );
                for( std::size_t i = 0; i < data.testsOrTags.size(); ++i )
                    parser.parse( data.testsOrTags[i] );
                m_testSpec = parser.testSpec();
            }
        }